

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::convert_packing(Mat *src,Mat *dst,int _packing,Allocator *allocator,int num_threads)

{
  Option *pOVar1;
  undefined8 in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  Option opt;
  ParamDict pd;
  Layer *packing;
  undefined8 in_stack_fffffffffffff9e8;
  ParamDict *this;
  undefined4 local_608;
  undefined4 uStack_604;
  undefined8 uStack_600;
  undefined4 local_5f8;
  undefined4 uStack_5f4;
  undefined4 uStack_5f0;
  int iStack_5ec;
  undefined8 local_5e8;
  ParamDict *in_stack_fffffffffffffa20;
  ParamDict local_5d0;
  Layer *local_30;
  undefined4 local_24;
  undefined8 local_20;
  int local_14;
  undefined8 local_10;
  undefined8 local_8;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_30 = create_layer((int)((ulong)in_stack_fffffffffffff9e8 >> 0x20));
  this = &local_5d0;
  ParamDict::ParamDict(in_stack_fffffffffffffa20);
  ParamDict::set(this,0,local_14);
  (*local_30->_vptr_Layer[2])(local_30,&local_5d0);
  pOVar1 = get_default_option();
  local_5e8._0_4_ = pOVar1->use_sgemm_convolution;
  local_5e8._4_4_ = pOVar1->use_int8_inference;
  local_608 = *(undefined4 *)pOVar1;
  local_5f8 = *(undefined4 *)&pOVar1->workspace_allocator;
  uStack_5f4 = *(undefined4 *)((long)&pOVar1->workspace_allocator + 4);
  uStack_5f0 = *(undefined4 *)&pOVar1->vulkan_compute;
  iStack_5ec = pOVar1->use_winograd_convolution;
  uStack_604 = local_24;
  uStack_600 = local_20;
  (*local_30->_vptr_Layer[7])(local_30,local_8,local_10,&local_608);
  if (local_30 != (Layer *)0x0) {
    (*local_30->_vptr_Layer[1])();
  }
  ParamDict::~ParamDict(this);
  return;
}

Assistant:

void convert_packing(const Mat& src, Mat& dst, int _packing, Allocator* allocator, int num_threads)
{
    ncnn::Layer* packing = ncnn::create_layer(ncnn::LayerType::Packing);

    ncnn::ParamDict pd;
    pd.set(0, _packing);

    packing->load_param(pd);

    ncnn::Option opt = ncnn::get_default_option();
    opt.num_threads = num_threads;
    opt.blob_allocator = allocator;

    packing->forward(src, dst, opt);

    delete packing;
}